

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O1

void __thiscall OpenMD::Velocitizer::scale(Velocitizer *this,RealType lambda)

{
  double *pdVar1;
  int iVar2;
  Snapshot *pSVar3;
  Molecule *pMVar4;
  pointer ppSVar5;
  StuntDouble *pSVar6;
  uint i;
  long lVar7;
  long lVar8;
  Vector3d j;
  Vector3d v;
  MoleculeIterator mi;
  double local_58 [4];
  double local_38 [4];
  MoleculeIterator local_18;
  
  local_18._M_node = (_Base_ptr)0x0;
  local_38[2] = 0.0;
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  local_58[2] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  pMVar4 = SimInfo::beginMolecule(this->info_,&local_18);
  if (pMVar4 != (Molecule *)0x0) {
    do {
      ppSVar5 = (pMVar4->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar5 ==
          (pMVar4->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar6 = (StuntDouble *)0x0;
      }
      else {
        pSVar6 = *ppSVar5;
      }
      while (pSVar6 != (StuntDouble *)0x0) {
        lVar7 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).velocity.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + pSVar6->storage_);
        local_38[2] = (double)*(undefined8 *)(lVar7 + 0x10 + (long)pSVar6->localIndex_ * 0x18);
        pdVar1 = (double *)(lVar7 + (long)pSVar6->localIndex_ * 0x18);
        local_38[0] = *pdVar1;
        local_38[1] = pdVar1[1];
        lVar7 = 0;
        do {
          local_38[lVar7] = local_38[lVar7] * lambda;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        pSVar3 = pSVar6->snapshotMan_->currentSnapshot_;
        lVar8 = (long)pSVar6->localIndex_;
        lVar7 = *(long *)((long)&(pSVar3->atomData).velocity.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + pSVar6->storage_);
        *(double *)(lVar7 + 0x10 + lVar8 * 0x18) = local_38[2];
        pdVar1 = (double *)(lVar7 + lVar8 * 0x18);
        *pdVar1 = local_38[0];
        pdVar1[1] = local_38[1];
        if (pSVar6->objType_ - otDAtom < 2) {
          lVar7 = *(long *)((long)&(pSVar3->atomData).angularMomentum.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + pSVar6->storage_);
          local_58[2] = (double)*(undefined8 *)(lVar7 + 0x10 + lVar8 * 0x18);
          pdVar1 = (double *)(lVar7 + lVar8 * 0x18);
          local_58[0] = *pdVar1;
          local_58[1] = pdVar1[1];
          lVar7 = 0;
          do {
            local_58[lVar7] = local_58[lVar7] * lambda;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          iVar2 = pSVar6->localIndex_;
          lVar7 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).
                                   angularMomentum.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + pSVar6->storage_);
          *(double *)(lVar7 + 0x10 + (long)iVar2 * 0x18) = local_58[2];
          pdVar1 = (double *)(lVar7 + (long)iVar2 * 0x18);
          *pdVar1 = local_58[0];
          pdVar1[1] = local_58[1];
        }
        ppSVar5 = ppSVar5 + 1;
        if (ppSVar5 ==
            (pMVar4->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar6 = (StuntDouble *)0x0;
        }
        else {
          pSVar6 = *ppSVar5;
        }
      }
      pMVar4 = SimInfo::nextMolecule(this->info_,&local_18);
    } while (pMVar4 != (Molecule *)0x0);
  }
  removeComDrift(this);
  if ((this->globals_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b == '\0') {
    removeAngularDrift(this);
  }
  return;
}

Assistant:

void Velocitizer::scale(RealType lambda) {
    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d v, j;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        v = sd->getVel();
        v *= lambda;
        sd->setVel(v);

        if (sd->isDirectional()) {
          j = sd->getJ();
          j *= lambda;
          sd->setJ(j);
        }
      }
    }

    removeComDrift();

    // Remove angular drift if we are not using periodic boundary
    // conditions:

    if (!globals_->getUsePeriodicBoundaryConditions()) removeAngularDrift();
  }